

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  char *pcVar2;
  size_type sVar3;
  int iVar4;
  size_type sVar5;
  char *pcVar6;
  undefined1 *local_48;
  pointer local_40;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (input->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + input->_M_string_length);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar3 = __return_storage_ptr__->_M_string_length;
  sVar5 = sVar3;
  pcVar6 = pcVar2;
  if (sVar3 == 0) {
LAB_001f4ee5:
    if (pcVar2 + sVar3 != pcVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_erase
                (__return_storage_ptr__,0,(long)pcVar6 - (long)pcVar2);
      goto LAB_001f4f0c;
    }
  }
  else {
    do {
      iVar4 = isspace((int)*pcVar6);
      if (iVar4 == 0) goto LAB_001f4ee5;
      sVar5 = sVar5 - 1;
      pcVar6 = pcVar6 + 1;
    } while (sVar5 != 0);
  }
  __return_storage_ptr__->_M_string_length = 0;
  *pcVar2 = '\0';
LAB_001f4f0c:
  local_40 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_38 = local_40 + __return_storage_ptr__->_M_string_length;
  std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<trim(std::__cxx11::string_const&)::_lambda(char)_2_>>
            (&local_48);
  __return_storage_ptr__->_M_string_length =
       (long)local_48 - (long)(__return_storage_ptr__->_M_dataplus)._M_p;
  *local_48 = 0;
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim( std::string const & input )
{
  std::string result = input;
  result.erase( result.begin(), std::ranges::find_if( result, []( char c ) noexcept { return !std::isspace( c ); } ) );
  result.erase( std::find_if( result.rbegin(), result.rend(), []( char c ) noexcept { return !std::isspace( c ); } ).base(), result.end() );
  return result;
}